

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DefUseManager::AnalyzeInstDef(DefUseManager *this,Instruction *inst)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type *ppIVar3;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_28;
  iterator iter;
  uint32_t def_id;
  Instruction *inst_local;
  DefUseManager *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
  ._M_cur._4_4_ = opt::Instruction::result_id(inst);
  if (iter.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>.
      _M_cur._4_4_ == 0) {
    ClearInst(this,inst);
  }
  else {
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
         ::find(&this->id_to_def_,
                (key_type *)
                ((long)&iter.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                        ._M_cur + 4));
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
         ::end(&this->id_to_def_);
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                             *)&local_28);
      ClearInst(this,ppVar2->second);
    }
    ppIVar3 = std::
              unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
              ::operator[](&this->id_to_def_,
                           (key_type *)
                           ((long)&iter.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                                   ._M_cur + 4));
    *ppIVar3 = inst;
  }
  return;
}

Assistant:

void DefUseManager::AnalyzeInstDef(Instruction* inst) {
  const uint32_t def_id = inst->result_id();
  if (def_id != 0) {
    auto iter = id_to_def_.find(def_id);
    if (iter != id_to_def_.end()) {
      // Clear the original instruction that defining the same result id of the
      // new instruction.
      ClearInst(iter->second);
    }
    id_to_def_[def_id] = inst;
  } else {
    ClearInst(inst);
  }
}